

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::Export_MetadataBoolean
          (X3DExporter *this,aiString *pKey,bool pValue,size_t pTabLevel)

{
  pointer pcVar1;
  _Node *p_Var2;
  char *pcVar3;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  allocator<char> local_89;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_48;
  
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"name","");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pKey->data,&local_89);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48,(SAttribute *)local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"value","");
  pcVar3 = "false";
  if (pValue) {
    pcVar3 = "true";
  }
  local_68._M_p = (pointer)&local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,pcVar3,pcVar3 + ((ulong)pValue ^ 5));
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48,(SAttribute *)local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"MetadataBoolean","");
  NodeHelper_OpenNode(this,(string *)local_88,pTabLevel,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_48);
  return;
}

Assistant:

void X3DExporter::Export_MetadataBoolean(const aiString& pKey, const bool pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", pValue ? "true" : "false"});
	NodeHelper_OpenNode("MetadataBoolean", pTabLevel, true, attr_list);
}